

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O2

uint ON_ModelComponent::Internal_SystemComponentHelper(void)

{
  long lVar1;
  long lVar2;
  
  if (Internal_SystemComponentHelper()::rc == '\0') {
    for (lVar2 = 0; lVar2 != 0x70; lVar2 = lVar2 + 8) {
      lVar1 = *(long *)((long)&PTR_Unset_0082b8d0 + lVar2);
      *(undefined2 *)(lVar1 + 0x2e) = 0xffff;
      *(undefined8 *)(lVar1 + 0x18) = 0;
    }
    for (lVar2 = 0; lVar2 != 0x110; lVar2 = lVar2 + 8) {
      lVar1 = *(long *)((long)&PTR_Continuous_0082b940 + lVar2);
      *(undefined2 *)(lVar1 + 0x2e) = 0x81df;
      *(undefined8 *)(lVar1 + 0x18) = 0;
    }
    Internal_SystemComponentHelper()::rc = '\x01';
  }
  return 0x30;
}

Assistant:

unsigned int ON_ModelComponent::Internal_SystemComponentHelper()
{
  static unsigned int rc = 0;
  if (0 == rc)
  {
    rc = 1;
    const ON_ModelComponent* list[] =
    {
      &ON_ModelComponent::Unset,
      &ON_InstanceDefinition::Unset,
      &ON_Linetype::Unset,
      &ON_Layer::Unset,
      &ON_TextStyle::Unset,
      &ON_DimStyle::Unset,
      &ON_Material::Unset,
      &ON_Material::Default,
      &ON_Material::DefaultLockedObject,
      &ON_TextureMapping::Unset,
      &ON_TextureMapping::SurfaceParameterTextureMapping,
      &ON_HatchPattern::Unset,
      &ON_Group::Unset,
      &ON_HistoryRecord::Empty
    };

    const ON_ModelComponent* list_localized_name[] =
    {
      &ON_Linetype::Continuous,
      &ON_Linetype::ByLayer,
      &ON_Linetype::ByParent,
      &ON_Linetype::Hidden,
      &ON_Linetype::Dashed,
      &ON_Linetype::DashDot,
      &ON_Linetype::Center,
      &ON_Linetype::Border,
      &ON_Linetype::Dots,

      &ON_Layer::Default,

      &ON_TextStyle::Default,
      &ON_TextStyle::ByLayer,
      &ON_TextStyle::ByParent,

      &ON_DimStyle::Default,
      &ON_DimStyle::DefaultInchDecimal,
      &ON_DimStyle::DefaultInchFractional,
      &ON_DimStyle::DefaultFootInchArchitecture,
      &ON_DimStyle::DefaultMillimeterSmall,
      &ON_DimStyle::DefaultMillimeterLarge,
      &ON_DimStyle::DefaultMillimeterArchitecture,
      &ON_DimStyle::DefaultFeetDecimal,
      &ON_DimStyle::DefaultModelUnitsDecimal,
      &ON_DimStyle::DefaultFeetEngrave,
      &ON_DimStyle::DefaultMillimeterEngrave,
      &ON_DimStyle::DefaultModelUnitsEngrave,
 
      &ON_HatchPattern::Solid,
      &ON_HatchPattern::Hatch1,
      &ON_HatchPattern::Hatch2,
      &ON_HatchPattern::Hatch3,
      &ON_HatchPattern::HatchDash,
      &ON_HatchPattern::Grid,
      &ON_HatchPattern::Grid60,
      &ON_HatchPattern::Plus,
      &ON_HatchPattern::Squares
    };

    const size_t list_count = sizeof(list) / sizeof(list[0]);
    for (size_t i = 0; i < list_count; i++)
    {
      *(const_cast<unsigned short*>(&list[i]->m_locked_status)) = 0xFFFFU;
      *(const_cast<ON__UINT64*>(&list[i]->m_content_version_number)) = 0;
    }

    const unsigned int name_bit = ON_ModelComponent::Attributes::NameAttribute;
    const unsigned int name_mask = ~name_bit;
    const unsigned short bits
      = (unsigned short)((name_mask & ON_ModelComponent::Attributes::AllAttributes) | ON_ModelComponent::Attributes::SystemComponentAttribute);
    const size_t list_localized_name_count = sizeof(list_localized_name) / sizeof(list_localized_name[0]);
    for (size_t i = 0; i < list_localized_name_count; i++)
    {
      *(const_cast<unsigned short*>(&list_localized_name[i]->m_locked_status)) = bits;
      *(const_cast<ON__UINT64*>(&list_localized_name[i]->m_content_version_number)) = 0;
    }

    rc = (unsigned int)(list_count + list_localized_name_count);
  }
  return rc;
}